

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

bool __thiscall FTraceInfo::CheckPlane(FTraceInfo *this,secplane_t *plane)

{
  double dVar1;
  TVector3<double> local_98;
  TVector3<double> local_80;
  double local_68;
  double hitdist;
  double local_48;
  double num;
  double local_28;
  double den;
  secplane_t *plane_local;
  FTraceInfo *this_local;
  
  den = (double)plane;
  plane_local = (secplane_t *)this;
  secplane_t::Normal((DVector3 *)&num,plane);
  local_28 = TVector3<double>::operator|((TVector3<double> *)&num,&this->Vec);
  if ((local_28 != 0.0) || (NAN(local_28))) {
    secplane_t::Normal((DVector3 *)&hitdist,(secplane_t *)den);
    dVar1 = TVector3<double>::operator|((TVector3<double> *)&hitdist,&this->Start);
    local_48 = secplane_t::fD((secplane_t *)den);
    local_48 = dVar1 + local_48;
    local_68 = -local_48 / local_28;
    if ((this->EnterDist <= local_68 && local_68 != this->EnterDist) && (local_68 < this->MaxDist))
    {
      ::operator*(&local_98,&this->Vec,local_68);
      TVector3<double>::operator+(&local_80,&this->Start,&local_98);
      TVector3<double>::operator=(&this->Results->HitPos,&local_80);
      SetSourcePosition(this);
      this->Results->Distance = local_68;
      this->Results->Fraction = local_68 / this->MaxDist;
      return true;
    }
  }
  return false;
}

Assistant:

bool FTraceInfo::CheckPlane (const secplane_t &plane)
{
	double den = plane.Normal() | Vec;

	if (den != 0)
	{
		double num = (plane.Normal() | Start) + plane.fD();

		double hitdist = -num / den;

		if (hitdist > EnterDist && hitdist < MaxDist)
		{
			Results->HitPos = Start + Vec * hitdist;
			SetSourcePosition();
			Results->Distance = hitdist;
			Results->Fraction = hitdist / MaxDist;
			return true;
		}
	}
	return false;
}